

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionModelMapping.cpp
# Opt level: O2

void __thiscall
TransitionModelMapping::TransitionModelMapping(TransitionModelMapping *this,int nrS,int nrJA)

{
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *this_00;
  bool bVar1;
  Matrix *T;
  
  TransitionModelDiscrete::TransitionModelDiscrete(&this->super_TransitionModelDiscrete,nrS,nrJA);
  (this->super_TransitionModelDiscrete).super_TransitionModelDiscreteInterface.super_TransitionModel
  ._vptr_TransitionModel = (_func_int **)&PTR__TransitionModelMapping_00606c60;
  (this->_m_T).
  super__Vector_base<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_T).
  super__Vector_base<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_T).
  super__Vector_base<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  while (bVar1 = nrJA != 0, nrJA = nrJA + -1, bVar1) {
    this_00 = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
               *)operator_new(0x28);
    boost::numeric::ublas::
    matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
    ::matrix(this_00,(long)nrS,(long)nrS);
    T = this_00;
    boost::numeric::ublas::
    matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
    ::clear(this_00);
    std::
    vector<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
    ::push_back(&this->_m_T,&T);
  }
  return;
}

Assistant:

TransitionModelMapping::TransitionModelMapping(int nrS, int nrJA) :
    TransitionModelDiscrete(nrS, nrJA)
{    
    Matrix *T;
    for(int a=0;a!=nrJA;++a)
    {
        T=new Matrix(nrS,nrS);
        T->clear();
        _m_T.push_back(T);
    }
}